

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llstk.c
# Opt level: O0

DLword * extendstack(void)

{
  ushort StackOffset;
  uint uVar1;
  LispPTR *pLVar2;
  DLword *pDVar3;
  LispPTR scanptr;
  LispPTR easp;
  
  StackOffset = InterfacePage->endofstack;
  uVar1 = (uint)StackOffset;
  if (uVar1 < (*LastStackAddr_word & 0xffff)) {
    if (((*GuardStackAddr_word & 0xffff) < uVar1) && (*STACKOVERFLOW_word == 0)) {
      extended_frame = 1;
      pLVar2 = NativeAligned4FromLAddr(*INTERRUPTSTATE_word);
      *(ushort *)((long)pLVar2 + 2) = *(ushort *)((long)pLVar2 + 2) & 0xfbff | 0x400;
      *PENDINGINTERRUPT_word = 0x4c;
      *STACKOVERFLOW_word = 0x4c;
    }
    newpage(uVar1 + 2 | 0x10000);
    pDVar3 = NativeAligned2FromStackOffset((DLword)(uVar1 + 2));
    pDVar3[0] = 0xfe;
    pDVar3[1] = 0xa000;
    InterfacePage->endofstack = StackOffset + 0x100;
    pDVar3 = NativeAligned2FromStackOffset(InterfacePage->endofstack);
    pDVar3[0] = 2;
    pDVar3[1] = 0xe000;
    pDVar3 = NativeAligned2FromStackOffset(StackOffset);
    pDVar3[0] = 2;
    pDVar3[1] = 0xa000;
    _scanptr = NativeAligned4FromStackOffset(StackOffset + 0x100);
  }
  else {
    _scanptr = (LispPTR *)0x0;
  }
  return (DLword *)_scanptr;
}

Assistant:

static DLword *extendstack(void) {
  LispPTR easp;
  LispPTR scanptr;

  easp = InterfacePage->endofstack;

  if (easp < LOLOC(*LastStackAddr_word)) {
    if ((easp > LOLOC(*GuardStackAddr_word)) && ((*STACKOVERFLOW_word) == NIL)) {
      extended_frame = 1;
      ((INTSTAT *)NativeAligned4FromLAddr(*INTERRUPTSTATE_word))->stackoverflow = 1;
      *STACKOVERFLOW_word = *PENDINGINTERRUPT_word = ATOM_T;
    }
    newpage(STK_OFFSET | (scanptr = easp + 2));
    /* I don't concern about DOLOCKPAGES */

    MAKEFREEBLOCK(NativeAligned2FromStackOffset(scanptr), DLWORDSPER_PAGE - 2);
    InterfacePage->endofstack = scanptr = easp + DLWORDSPER_PAGE;
    SETUPGUARDBLOCK(NativeAligned2FromStackOffset(InterfacePage->endofstack), 2);
    MAKEFREEBLOCK(NativeAligned2FromStackOffset(easp), 2);
    return ((DLword *)NativeAligned4FromStackOffset(scanptr));
  } else
    return (NIL);
}